

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_number.cpp
# Opt level: O0

int tagFUNCTION::CompareFunctionName(wchar_t *a,int a_count,wchar_t *b)

{
  int local_34;
  int a_index;
  wchar_t d;
  wchar_t c;
  wchar_t *b_local;
  int a_count_local;
  wchar_t *a_local;
  
  local_34 = 0;
  _d = b;
  while( true ) {
    if (a_count <= local_34) {
      if (*_d < L'\x01') {
        if (*_d < L'\0') {
          a_local._4_4_ = 1;
        }
        else {
          a_local._4_4_ = 0;
        }
      }
      else {
        a_local._4_4_ = -1;
      }
      return a_local._4_4_;
    }
    a_index = a[local_34];
    if ((L'@' < a_index) && (a_index < L'[')) {
      a_index = a_index + L' ';
    }
    if (a_index < *_d) {
      return -1;
    }
    if (*_d < a_index) {
      return 1;
    }
    if (a_index == 0) break;
    local_34 = local_34 + 1;
    _d = _d + 1;
  }
  return 0;
}

Assistant:

static int CompareFunctionName(
    const wchar_t* a,
    int a_count,
    const wchar_t* b
    )
  {
    wchar_t c, d=0;
    for ( int a_index = 0; a_index < a_count; a_index++ )
    {
      c = a[a_index];
      d = *b++;
      if ( c >= 'A' && c <= 'Z' )
        c += 'a'-'A';
      if ( c < d )
        return -1;
      if ( c > d )
        return 1;
      if ( 0 == c )
        return 0;
    }
    d = *b++;
    if ( 0 < d )
      return -1;
    if ( 0 > d )
      return 1;
    return 0;
  }